

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::Node::EndPropertiesBinary(Node *this,StreamWriterLE *s,size_t num_properties)

{
  size_t sVar1;
  size_t pOffset;
  size_t property_section_size;
  size_t pos;
  size_t num_properties_local;
  StreamWriterLE *s_local;
  Node *this_local;
  
  if (num_properties != 0) {
    pOffset = StreamWriter<false,_false>::Tell(s);
    if (pOffset <= this->property_start) {
      __assert_fail("pos > property_start",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/FBX/FBXExportNode.cpp"
                    ,0x161,
                    "void Assimp::FBX::Node::EndPropertiesBinary(Assimp::StreamWriterLE &, size_t)")
      ;
    }
    sVar1 = this->property_start;
    StreamWriter<false,_false>::Seek(s,this->start_pos + 4,aiOrigin_SET);
    StreamWriter<false,_false>::PutU4(s,(uint32_t)num_properties);
    StreamWriter<false,_false>::PutU4(s,(int)pOffset - (int)sVar1);
    StreamWriter<false,_false>::Seek(s,pOffset,aiOrigin_SET);
  }
  return;
}

Assistant:

void FBX::Node::EndPropertiesBinary(
    Assimp::StreamWriterLE &s,
    size_t num_properties
) {
    if (num_properties == 0) { return; }
    size_t pos = s.Tell();
    ai_assert(pos > property_start);
    size_t property_section_size = pos - property_start;
    s.Seek(start_pos + 4);
    s.PutU4(uint32_t(num_properties));
    s.PutU4(uint32_t(property_section_size));
    s.Seek(pos);
}